

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcontext_p.h
# Opt level: O2

QOpenGLFunctionsPrivateEx * __thiscall
QOpenGLMultiGroupSharedResource::value<QOpenGLFunctionsPrivateEx>
          (QOpenGLMultiGroupSharedResource *this,QOpenGLContext *context)

{
  QOpenGLContextGroup *pQVar1;
  QOpenGLFunctionsPrivateEx *this_00;
  long in_FS_OFFSET;
  QOpenGLSharedResource *local_40;
  QOpenGLMultiGroupSharedResource *local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QOpenGLContext::shareGroup(context);
  local_30._0_8_ = &this->m_mutex;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QRecursiveMutex::lock((QRecursiveMutex *)local_30._0_8_);
  local_30[8] = true;
  local_40 = (QOpenGLSharedResource *)0x0;
  local_38 = this;
  this_00 = (QOpenGLFunctionsPrivateEx *)
            QHash<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*>::value
                      ((QHash<QOpenGLMultiGroupSharedResource_*,_QOpenGLSharedResource_*> *)
                       (*(long *)&pQVar1->field_0x8 + 0xb0),&local_38,&local_40);
  if (this_00 == (QOpenGLFunctionsPrivateEx *)0x0) {
    this_00 = (QOpenGLFunctionsPrivateEx *)operator_new(0xb78);
    QOpenGLFunctionsPrivateEx::QOpenGLFunctionsPrivateEx(this_00,context);
    insert(this,context,(QOpenGLSharedResource *)this_00);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

T *value(QOpenGLContext *context) {
        QOpenGLContextGroup *group = context->shareGroup();
        // Have to use our own mutex here, not the group's, since
        // m_groups has to be protected too against any concurrent access.
        QMutexLocker locker(&m_mutex);
        T *resource = static_cast<T *>(group->d_func()->m_resources.value(this, nullptr));
        if (!resource) {
            resource = new T(context);
            insert(context, resource);
        }
        return resource;
    }